

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

void Ivy_ManCleanupSeq_rec(Ivy_Obj_t *pObj)

{
  while( true ) {
    if ((*(uint *)&pObj->field_0x8 & 0x10) != 0) {
      return;
    }
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 | 0x10;
    if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
      Ivy_ManCleanupSeq_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    }
    if (pObj->pFanin1 == (Ivy_Obj_t *)0x0) break;
    pObj = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  return;
}

Assistant:

void Ivy_ManCleanupSeq_rec( Ivy_Obj_t * pObj )
{
    if ( Ivy_ObjIsMarkA(pObj) )
        return;
    Ivy_ObjSetMarkA(pObj);
    if ( pObj->pFanin0 != NULL )
        Ivy_ManCleanupSeq_rec( Ivy_ObjFanin0(pObj) );
    if ( pObj->pFanin1 != NULL )
        Ivy_ManCleanupSeq_rec( Ivy_ObjFanin1(pObj) );
}